

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O3

genxStatus sendx(genxWriter w,constUtf8 s)

{
  genxStatus gVar1;
  int iVar2;
  
  if (w->sender != (genxSender *)0x0) {
    gVar1 = (*w->sender->send)(w->userData,s);
    return gVar1;
  }
  iVar2 = fputs((char *)s,(FILE *)w->file);
  gVar1 = GENX_IO_ERROR;
  if (iVar2 != -1) {
    gVar1 = GENX_SUCCESS;
  }
  return gVar1;
}

Assistant:

static genxStatus sendx(genxWriter w, constUtf8 s)
{
  if (w->sender)
    return (*w->sender->send)(w->userData, s);
  else
  {
    if (fputs((const char *) s, w->file) == -1)
      return GENX_IO_ERROR;
    else
      return GENX_SUCCESS;
  }
}